

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::count_digits<4u,fmt::v6::internal::fallback_uintptr>(fallback_uintptr n)

{
  bool bVar1;
  int char_digits;
  int i;
  int local_18;
  int local_c;
  byte local_8 [5];
  byte abStack_3 [3];
  
  local_c = 7;
  while( true ) {
    bVar1 = false;
    if (0 < local_c) {
      bVar1 = local_8[local_c] == 0;
    }
    if (!bVar1) break;
    local_c = local_c + -1;
  }
  if (local_c < 0) {
    local_18 = 1;
  }
  else {
    local_18 = count_digits<4u,unsigned_int>((uint)local_8[local_c]);
    local_18 = local_c * 2 + local_18;
  }
  return local_18;
}

Assistant:

FMT_FUNC int count_digits<4>(internal::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}